

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderVertexSpacing::initTest(TessellationShaderVertexSpacing *this)

{
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing vertex_spacing;
  pointer pcVar1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  pointer p_Var4;
  undefined8 uVar5;
  int iVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  TestError *this_01;
  NotSupportedError *this_02;
  _tessellation_primitive_mode primitive_mode_00;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [8];
  ulong uVar12;
  _run run;
  long local_230;
  string vs_mode_string;
  string primitive_mode_string;
  undefined1 local_1b8 [8];
  pointer p_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1a8 [6];
  ios_base local_140 [272];
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])aaStack_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b8);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils = this_00;
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                  ,0x38e);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                  ,0x391);
  (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                     &this->m_gl_max_tess_gen_level_value);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                  ,0x395);
  lVar10 = 0;
  do {
    primitive_mode = (&DAT_01b6d5b8)[lVar10];
    TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
              ((_tessellation_levels_set *)local_1b8,primitive_mode,
               this->m_gl_max_tess_gen_level_value,
               TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);
    uVar5 = aaStack_1a8[0]._M_allocated_capacity;
    p_Var4 = p_Stack_1b0;
    auVar3 = local_1b8;
    local_230 = 0;
    do {
      if (auVar3 != (undefined1  [8])p_Var4) {
        vertex_spacing =
             (&deqp::gles31::Functional::(anonymous_namespace)::randomInterpolation(de::Random&)::
               s_validInterpolations)[local_230];
        auVar11 = auVar3;
        do {
          run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          run.n_vertices = 0;
          run.inner[0] = 0.0;
          run.inner[1] = 0.0;
          run.outer[0] = 0.0;
          run.outer[1] = 0.0;
          run.outer[2] = 0.0;
          run.outer[3] = 0.0;
          run.primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
          run.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
          if ((local_230 != 2 || lVar10 != 2) ||
             ((1.0 < ((pointer)auVar11)->inner[0] && (1.0 < ((pointer)auVar11)->inner[1])))) {
            run.inner = *&((pointer)auVar11)->inner;
            run.outer._0_8_ = *(undefined8 *)((pointer)auVar11)->outer;
            run.outer._8_8_ = *(undefined8 *)(((pointer)auVar11)->outer + 2);
            run.vertex_spacing = vertex_spacing;
            run.primitive_mode = primitive_mode;
            run.n_vertices =
                 TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                           (this->m_utils,primitive_mode,run.inner,run.outer,vertex_spacing,true);
            if (run.n_vertices == 0) {
              TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                        (&primitive_mode_string,(TessellationShaderUtils *)(ulong)primitive_mode,
                         primitive_mode_00);
              TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                        (&vs_mode_string,(TessellationShaderUtils *)(ulong)vertex_spacing,
                         vertex_spacing_00);
              local_1b8 = (undefined1  [8])
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&p_Stack_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&p_Stack_1b0,
                         "No vertices were generated by tessellator for: inner tess levels:[",0x42);
              std::ostream::_M_insert<double>((double)run.inner[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&p_Stack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)run.inner[1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&p_Stack_1b0,"], outer tess levels:[",0x16);
              std::ostream::_M_insert<double>((double)run.outer[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&p_Stack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)run.outer[1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&p_Stack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)run.outer[2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&p_Stack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)run.outer[3]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&p_Stack_1b0,"], primitive mode: ",0x13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&p_Stack_1b0,primitive_mode_string._M_dataplus._M_p,
                         primitive_mode_string._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&p_Stack_1b0,", vertex spacing: ",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&p_Stack_1b0,vs_mode_string._M_dataplus._M_p,
                         vs_mode_string._M_string_length);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&p_Stack_1b0);
              std::ios_base::~ios_base(local_140);
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,"Zero vertices were generated by tessellator",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x3df);
              __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            TessellationShaderUtils::getDataGeneratedByTessellator
                      ((vector<char,_std::allocator<char>_> *)local_1b8,this->m_utils,run.inner,true
                       ,run.primitive_mode,TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
                       run.vertex_spacing,run.outer);
            pcVar2 = run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            pcVar1 = run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)local_1b8;
            run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)p_Stack_1b0;
            run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)aaStack_1a8[0]._0_8_;
            local_1b8 = (undefined1  [8])0x0;
            p_Stack_1b0 = (pointer)0x0;
            aaStack_1a8[0]._M_allocated_capacity = (pointer)0x0;
            if (pcVar1 != (pointer)0x0) {
              operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
            }
            if (local_1b8 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1b8,
                              aaStack_1a8[0]._M_allocated_capacity - (long)local_1b8);
            }
            if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
              run.data_cartesian = (float *)operator_new__((ulong)(run.n_vertices * 2) << 2);
              if (run.n_vertices != 0) {
                uVar8 = 0;
                uVar9 = 0;
                uVar12 = 0;
                do {
                  TessellationShaderUtils::convertBarycentricCoordinatesToCartesian
                            ((float *)(run.data.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + (ulong)uVar8 * 4),
                             run.data_cartesian + uVar9);
                  uVar12 = uVar12 + 1;
                  uVar9 = uVar9 + 2;
                  uVar8 = uVar8 + 3;
                } while (uVar12 < run.n_vertices);
              }
            }
            else {
              run.data_cartesian = (float *)0x0;
            }
            std::
            vector<glcts::TessellationShaderVertexSpacing::_run,_std::allocator<glcts::TessellationShaderVertexSpacing::_run>_>
            ::push_back(&this->m_runs,&run);
          }
          if (run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          auVar11 = (undefined1  [8])((long)auVar11 + 0x18);
        } while (auVar11 != (undefined1  [8])p_Var4);
      }
      local_230 = local_230 + 1;
    } while (local_230 != 4);
    if (auVar3 != (undefined1  [8])0x0) {
      operator_delete((void *)auVar3,uVar5 - (long)auVar3);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return;
}

Assistant:

void TessellationShaderVertexSpacing::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &m_gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	const _tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD,
															 TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT };
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	/* Iterate through all primitive modes */
	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		/* Generate tessellation level set for current primitive mode */
		_tessellation_levels_set tess_levels_set;

		tess_levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			primitive_mode, m_gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);

		/* Iterate through all vertex spacing modes */
		for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
		{
			_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

			/* Iterate through all tessellation level combinations */
			for (_tessellation_levels_set_const_iterator tess_levels_set_iterator = tess_levels_set.begin();
				 tess_levels_set_iterator != tess_levels_set.end(); tess_levels_set_iterator++)
			{
				const _tessellation_levels& tess_levels = *tess_levels_set_iterator;
				_run						run;

				/* Skip border cases that this test cannot handle */
				if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS &&
					vs_mode == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD &&
					(tess_levels.inner[0] <= 1 || tess_levels.inner[1] <= 1))
				{
					continue;
				}

				/* Fill run descriptor */
				memcpy(run.inner, tess_levels.inner, sizeof(run.inner));
				memcpy(run.outer, tess_levels.outer, sizeof(run.outer));

				run.primitive_mode = primitive_mode;
				run.vertex_spacing = vs_mode;

				/* Retrieve vertex data for both passes */
				run.n_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
					run.primitive_mode, run.inner, run.outer, run.vertex_spacing, true); /* is_point_mode_enabled */

				if (run.n_vertices == 0)
				{
					std::string primitive_mode_string =
						TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
					std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

					m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
																   "inner tess levels:"
																   "["
									   << run.inner[0] << ", " << run.inner[1] << "]"
																				  ", outer tess levels:"
																				  "["
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << "]"
														  ", primitive mode: "
									   << primitive_mode_string << ", vertex spacing: " << vs_mode_string
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Zero vertices were generated by tessellator");
				}

				/* Retrieve the data buffers */
				run.data = m_utils->getDataGeneratedByTessellator(
					run.inner, true, /* is_point_mode_enabled */
					run.primitive_mode, TESSELLATION_SHADER_VERTEX_ORDERING_CCW, run.vertex_spacing, run.outer);

				/* 'triangles' tessellation data is expressed in barycentric coordinates. Before we can
				 * continue, we need to convert the data to Euclidean space */
				if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					run.data_cartesian = new float[run.n_vertices * 2 /* components */];

					for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
					{
						const float* barycentric_vertex_data =
							(const float*)(&run.data[0]) + n_vertex * 3;						  /* components */
						float* cartesian_vertex_data = (float*)run.data_cartesian + n_vertex * 2; /* components */

						TessellationShaderUtils::convertBarycentricCoordinatesToCartesian(barycentric_vertex_data,
																						  cartesian_vertex_data);
					}
				} /* if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */
				else
				{
					run.data_cartesian = DE_NULL;
				}

				/* Store the run data */
				m_runs.push_back(run);
			} /* for (all tessellation level values ) */
		}	 /* for (all primitive modes) */
	}		  /* for (all vertex spacing modes) */
}